

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# talg.c
# Opt level: O2

void linspace(double *x,int N,double xlo,double xhi)

{
  long lVar1;
  
  *x = xlo;
  x[(long)N + -1] = xhi;
  for (lVar1 = 1; lVar1 < (long)N + -1; lVar1 = lVar1 + 1) {
    x[lVar1] = (double)(int)lVar1 * ((xhi - xlo) / (double)(N + -1)) + xlo;
  }
  return;
}

Assistant:

void linspace(double *x, int N,double xlo,double xhi) {
    int i;
    double intv;

    intv = (xhi - xlo)/(double)(N-1);
    x[0] = xlo;
    x[N-1] = xhi;

    for(i = 1; i < N-1;++i) {
        x[i] = xlo + intv * (double) i;
    }
}